

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void set_cc_op(DisasContext_conflict2 *s,CCOp_conflict op)

{
  CCOp_conflict CVar1;
  TCGContext_conflict2 *tcg_ctx;
  byte bVar2;
  
  CVar1 = s->cc_op;
  if (CVar1 != op) {
    tcg_ctx = s->uc->tcg_ctx;
    s->cc_op = op;
    s->cc_op_synced = 0;
    bVar2 = ~"\x1f\x1f\x1a\x1a\x1a\x1a\x1a\x1a\x1a\x1a\x1a\x18"[op] &
            "\x1f\x1f\x1a\x1a\x1a\x1a\x1a\x1a\x1a\x1a\x1a\x18"[CVar1];
    if ((bVar2 & 1) != 0) {
      tcg_gen_discard_i32(tcg_ctx,QREG_CC_C);
    }
    if ((bVar2 & 4) != 0) {
      tcg_gen_discard_i32(tcg_ctx,QREG_CC_Z);
    }
    if ((bVar2 & 2) != 0) {
      tcg_gen_discard_i32(tcg_ctx,QREG_CC_V);
      return;
    }
  }
  return;
}

Assistant:

static void set_cc_op(DisasContext *s, CCOp op)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    CCOp old_op = s->cc_op;
    int dead;

    if (old_op == op) {
        return;
    }
    s->cc_op = op;
    s->cc_op_synced = 0;

    /*
     * Discard CC computation that will no longer be used.
     * Note that X and N are never dead.
     */
    dead = cc_op_live[old_op] & ~cc_op_live[op];
    if (dead & CCF_C) {
        tcg_gen_discard_i32(tcg_ctx, QREG_CC_C);
    }
    if (dead & CCF_Z) {
        tcg_gen_discard_i32(tcg_ctx, QREG_CC_Z);
    }
    if (dead & CCF_V) {
        tcg_gen_discard_i32(tcg_ctx, QREG_CC_V);
    }
}